

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O1

void H3_compute(picnic_instance_t *pp,uint8_t *hash,uint8_t *ch)

{
  byte bVar1;
  byte bVar2;
  ulong databitlen;
  uint rate;
  byte *pbVar3;
  uint uVar4;
  hash_context ctx;
  BitSequence local_129;
  byte *local_128;
  ulong local_120;
  ulong local_118;
  Keccak_HashInstance local_110;
  
  if ((ulong)pp->num_rounds != 0) {
    bVar1 = pp->digest_size;
    local_118 = (ulong)bVar1;
    pbVar3 = ch + pp->num_rounds;
    databitlen = (ulong)((uint)bVar1 * 8);
    uVar4 = 0;
    local_128 = pbVar3;
    local_120 = databitlen;
    do {
      if ((uint)bVar1 << 3 <= uVar4) {
        local_129 = '\x01';
        if ((char)local_118 == ' ') {
          rate = 0x540;
          uVar4 = 0x100;
        }
        else {
          rate = 0x440;
          uVar4 = 0x200;
        }
        Keccak_HashInitialize(&local_110,rate,uVar4,0,'\x1f');
        Keccak_HashUpdate(&local_110,&local_129,8);
        Keccak_HashUpdate(&local_110,hash,databitlen);
        uVar4 = 0;
        Keccak_HashFinal(&local_110,(BitSequence *)0x0);
        Keccak_HashSqueeze(&local_110,hash,databitlen);
        pbVar3 = local_128;
      }
      bVar2 = hash[uVar4 >> 3] >> ((byte)(6 - ((byte)uVar4 & 7)) & 0x1f);
      if ((~bVar2 & 3) != 0) {
        *ch = bVar2 & 3;
        ch = ch + 1;
      }
      uVar4 = uVar4 + 2;
    } while (ch < pbVar3);
  }
  return;
}

Assistant:

static void H3_compute(const picnic_instance_t* pp, uint8_t* hash, uint8_t* ch) {
  const unsigned int digest_size      = pp->digest_size;
  const unsigned int digest_size_bits = digest_size << 3;

  // Pick bits from hash
  uint8_t* eof         = ch + pp->num_rounds;
  unsigned int bit_idx = 0;
  while (ch < eof) {
    if (bit_idx >= digest_size_bits) {
      hash_context ctx;
      hash_init_prefix(&ctx, digest_size, HASH_PREFIX_1);
      hash_update(&ctx, hash, digest_size);
      hash_final(&ctx);
      hash_squeeze(&ctx, hash, digest_size);
      hash_clear(&ctx);
      bit_idx = 0;
    }

    const uint8_t twobits = (hash[bit_idx >> 3] >> ((6 - (bit_idx & 0x7)))) & 0x3;
    if (twobits != 0x3) {
      *ch++ = twobits;
    }
    bit_idx += 2;
  }
}